

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  OfType OVar1;
  _Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  os;
  pointer pcVar2;
  pointer pMVar3;
  undefined8 uVar4;
  bool bVar5;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar6;
  size_t sVar7;
  char *pcVar8;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar9;
  string elementName;
  ReusableStringStream rss;
  ScopedElement e;
  char local_c9;
  undefined1 local_c8 [32];
  size_t local_a8;
  string local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  ReusableStringStream local_58;
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar1 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  pcVar8 = "failure";
  if (OVar1 < Exception) {
    if (1 < (uint)(OVar1 + ~FailureBit)) {
      if ((OVar1 != Unknown) && (OVar1 != FailureBit)) goto LAB_00193054;
LAB_0019301c:
      pcVar8 = "internalError";
    }
  }
  else {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto LAB_0019301c;
      if (OVar1 != ThrewException) goto LAB_00193054;
    }
    else {
      if (OVar1 == DidntThrowException) goto LAB_00193046;
      if (OVar1 != FatalErrorCondition) goto LAB_00193054;
    }
    pcVar8 = "error";
  }
LAB_00193046:
  std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)pcVar8);
LAB_00193054:
  this_01 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_01,(XmlFormatting)&local_78);
  pcVar8 = local_c8 + 0x10;
  local_c8._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"message","");
  this_00 = &stats->assertionResult;
  AssertionResult::getExpression_abi_cxx11_(&local_98,this_00);
  XmlWriter::writeAttribute(this_01,(string *)local_c8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_c8._0_8_ != pcVar8) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_c8._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"type","");
  local_98._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_98._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)local_c8,(StringRef *)&local_98);
  if ((char *)local_c8._0_8_ != pcVar8) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  local_58.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_0023f428;
  pSVar6 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar7 = StringStreams::add(&pSVar6->super_StringStreams);
  local_58.m_index = sVar7;
  pSVar6 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os._M_head_impl =
       *(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(pSVar6->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar7]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_58.m_oss = (ostream *)os._M_head_impl;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_c8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_c8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_c8,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,(char *)local_c8._0_8_,local_c8._8_8_);
      if ((char *)local_c8._0_8_ != pcVar8) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      local_c8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_c8,1);
    }
    bVar5 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_98,this_00);
      clara::TextFlow::Column::Column((Column *)local_c8,&local_98);
      local_a8 = 2;
      clara::TextFlow::operator<<((ostream *)os._M_head_impl,(Column *)local_c8);
      local_c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,&local_c9,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_c8._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar2,
             pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
  uVar4 = local_c8._8_8_;
  if ((char *)local_c8._0_8_ != pcVar8) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c8._0_8_ = pcVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar2,
               pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,(char *)local_c8._0_8_,local_c8._8_8_);
    local_98._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,(char *)&local_98,1);
    if ((char *)local_c8._0_8_ != pcVar8) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  pMVar9 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar9 != pMVar3) {
    do {
      if (pMVar9->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os._M_head_impl,(pMVar9->message)._M_dataplus._M_p,
                   (pMVar9->message)._M_string_length);
        local_c8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_c8,1);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"at ",3);
  local_c8._0_8_ = (stats->assertionResult).m_info.lineInfo.file;
  local_c8._8_8_ = (stats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)os._M_head_impl,(SourceLineInfo *)local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_01,(string *)local_c8,Newline);
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }